

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

BuildNode * __thiscall
anon_unknown.dwarf_ecf33::BuildSystemEngineDelegate::lookupNode
          (BuildSystemEngineDelegate *this,StringRef name)

{
  StringRef Key;
  bool bVar1;
  BuildDescription *pBVar2;
  node_set *pnVar3;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
  *pSVar4;
  pointer ppVar5;
  mapped_type *this_00;
  StringRef name_00;
  string local_b0;
  BuildSystemEngineDelegate *local_90;
  char *local_88;
  undefined1 local_80 [8];
  unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
  nodeOwner;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
  local_50;
  iterator it_1;
  BuildSystemImpl *local_40;
  BuildNode *node;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  local_28;
  const_iterator it;
  BuildSystemEngineDelegate *this_local;
  StringRef name_local;
  
  name_local.Data = (char *)name.Length;
  this_local = (BuildSystemEngineDelegate *)name.Data;
  it.
  super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
          )(StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_>
            )this;
  pBVar2 = getBuildDescription(this);
  pnVar3 = llbuild::buildsystem::BuildDescription::getNodes(pBVar2);
  Key.Length = (size_t)name_local.Data;
  Key.Data = (char *)this_local;
  local_28.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
                 ::find(pnVar3,Key);
  pBVar2 = getBuildDescription(this);
  pnVar3 = llbuild::buildsystem::BuildDescription::getNodes(pBVar2);
  it_1.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
             )llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
              ::end(pnVar3);
  bVar1 = llvm::
          iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
          ::operator!=((iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
                        *)&local_28,
                       (StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>
                        *)&it_1);
  if (bVar1) {
    pSVar4 = llvm::
             iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
             ::operator->((iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>_>_&>
                           *)&local_28);
    local_40 = (BuildSystemImpl *)
               std::
               unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
               ::get(&pSVar4->second);
  }
  else {
    llvm::StringRef::operator_cast_to_string
              ((string *)&stack0xffffffffffffff90,(StringRef *)&this_local);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>_>
         ::find(&this->dynamicNodes,(key_type *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    nodeOwner._M_t.
    super___uniq_ptr_impl<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::buildsystem::BuildNode_*,_std::default_delete<llbuild::buildsystem::BuildNode>_>
    .super__Head_base<0UL,_llbuild::buildsystem::BuildNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>,_true,_true>
          )std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>_>
           ::end(&this->dynamicNodes);
    bVar1 = std::__detail::operator!=
                      (&local_50,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_true>
                        *)&nodeOwner);
    if (bVar1) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>,_false,_true>
                             *)&local_50);
      local_40 = (BuildSystemImpl *)
                 std::
                 unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                 ::get(&ppVar5->second);
    }
    else {
      local_90 = this_local;
      local_88 = name_local.Data;
      name_00.Length = (size_t)this_local;
      name_00.Data = (char *)this->system;
      BuildSystemImpl::createNode((BuildSystemImpl *)local_80,name_00,SUB81(name_local.Data,0));
      local_40 = (BuildSystemImpl *)
                 std::
                 unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                 ::get((unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                        *)local_80);
      llvm::StringRef::operator_cast_to_string(&local_b0,(StringRef *)&this_local);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>_>_>_>
                ::operator[](&this->dynamicNodes,&local_b0);
      std::
      unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
      ::operator=(this_00,(unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                           *)local_80);
      std::__cxx11::string::~string((string *)&local_b0);
      std::
      unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
      ::~unique_ptr((unique_ptr<llbuild::buildsystem::BuildNode,_std::default_delete<llbuild::buildsystem::BuildNode>_>
                     *)local_80);
    }
  }
  return (BuildNode *)local_40;
}

Assistant:

BuildNode *BuildSystemEngineDelegate::lookupNode(StringRef name) {
  // Find the node.
  auto it = getBuildDescription().getNodes().find(name);
  BuildNode* node;
  if (it != getBuildDescription().getNodes().end()) {
    node = static_cast<BuildNode*>(it->second.get());
  } else {
    auto it = dynamicNodes.find(name);
    if (it != dynamicNodes.end()) {
      node = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto nodeOwner = system.createNode(
                                         name, /*isImplicit=*/true);
      node = nodeOwner.get();
      dynamicNodes[name] = std::move(nodeOwner);
    }
  }
  return node;
}